

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  rtree_ctx_cache_elm_t *prVar3;
  ulong *puVar4;
  bin_t *bin;
  rtree_leaf_elm_t *prVar5;
  arena_t *arena;
  bin_t *pbVar6;
  rtree_leaf_elm_t *prVar7;
  pthread_mutex_t *__mutex;
  uint uVar8;
  int iVar9;
  rtree_leaf_elm_t *prVar10;
  arena_tdata_t *paVar11;
  ulong uVar12;
  ulong uVar13;
  rtree_ctx_cache_elm_t *prVar14;
  rtree_ctx_cache_elm_t *prVar15;
  extent_t *slab;
  mutex_prof_data_t *data;
  rtree_ctx_t *ctx;
  bool bVar16;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar10 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar4 = (ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  prVar5 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar12);
  if (prVar5 == prVar10) {
    prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar4[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar10) {
    prVar7 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar5;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
    *puVar4 = (ulong)prVar10;
    puVar4[1] = (ulong)prVar7;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar7->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar14 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar10) {
      uVar13 = 0;
      bVar16 = false;
    }
    else {
      uVar12 = 1;
      prVar15 = prVar14;
      do {
        uVar13 = uVar12;
        bVar16 = 6 < uVar13;
        if (uVar13 == 7) goto LAB_0010ec45;
        prVar14 = prVar15 + 1;
        prVar3 = prVar15 + 1;
        uVar12 = uVar13 + 1;
        prVar15 = prVar14;
      } while ((rtree_leaf_elm_t *)prVar3->leafkey != prVar10);
      bVar16 = 6 < uVar13;
    }
    prVar7 = prVar14->leaf;
    prVar14->leafkey = ctx->l2_cache[uVar13].leafkey;
    prVar14->leaf = ctx->l2_cache[uVar13].leaf;
    ctx->l2_cache[uVar13].leafkey = (uintptr_t)prVar5;
    ctx->l2_cache[uVar13].leaf = (rtree_leaf_elm_t *)puVar4[1];
    *puVar4 = (ulong)prVar10;
    puVar4[1] = (ulong)prVar7;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar7->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0010ec45:
    if (bVar16) {
      prVar10 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  slab = (extent_t *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  arena = (arena_t *)arenas[(uint)slab->e_bits & 0xfff].repr;
  uVar12 = slab->e_bits >> 0x12 & 0xff;
  uVar8 = (uint)(slab->e_bits >> 0x24) & 0x3f;
  pbVar6 = arena->bins[uVar12].bin_shards;
  bin = pbVar6 + uVar8;
  __mutex = (pthread_mutex_t *)((long)&pbVar6[uVar8].lock.field_0 + 0x40);
  iVar9 = pthread_mutex_trylock(__mutex);
  if (iVar9 != 0) {
    malloc_mutex_lock_slow(&bin->lock);
    (bin->lock).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
    (bin->lock).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  arena_dalloc_bin_locked_impl(tsdn,arena,bin,(szind_t)uVar12,slab,ptr,false);
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  if (tsdn != (tsdn_t *)0x0) {
    uVar8 = arena->base->ind;
    paVar11 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata;
    if ((paVar11 == (arena_tdata_t *)0x0) ||
       ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar8)) {
      paVar11 = arena_tdata_get_hard(&tsdn->tsd,uVar8);
    }
    else {
      paVar11 = paVar11 + uVar8;
    }
    if ((paVar11 != (arena_tdata_t *)0x0) &&
       (iVar9 = (paVar11->decay_ticker).tick, (paVar11->decay_ticker).tick = iVar9 + -1, iVar9 < 1))
    {
      (paVar11->decay_ticker).tick = (paVar11->decay_ticker).nticks;
      arena_decay(tsdn,arena,false,false);
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	extent_t *extent = iealloc(tsdn, ptr);
	arena_t *arena = extent_arena_get(extent);

	arena_dalloc_bin(tsdn, arena, extent, ptr);
	arena_decay_tick(tsdn, arena);
}